

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

void * zuser_malloc(int bytes,int which_end,GlobalLU_t *Glu)

{
  void *local_28;
  void *buf;
  GlobalLU_t *Glu_local;
  int which_end_local;
  int bytes_local;
  
  if (bytes + (Glu->stack).used < (Glu->stack).size) {
    if (which_end == 0) {
      local_28 = (void *)((long)(Glu->stack).array + (long)(Glu->stack).top1);
      (Glu->stack).top1 = bytes + (Glu->stack).top1;
    }
    else {
      (Glu->stack).top2 = (Glu->stack).top2 - bytes;
      local_28 = (void *)((long)(Glu->stack).array + (long)(Glu->stack).top2);
    }
    (Glu->stack).used = bytes + (Glu->stack).used;
    _which_end_local = local_28;
  }
  else {
    _which_end_local = (void *)0x0;
  }
  return _which_end_local;
}

Assistant:

void *zuser_malloc(int bytes, int which_end, GlobalLU_t *Glu)
{
    void *buf;
    
    if ( StackFull(bytes) ) return (NULL);

    if ( which_end == HEAD ) {
	buf = (char*) Glu->stack.array + Glu->stack.top1;
	Glu->stack.top1 += bytes;
    } else {
	Glu->stack.top2 -= bytes;
	buf = (char*) Glu->stack.array + Glu->stack.top2;
    }
    
    Glu->stack.used += bytes;
    return buf;
}